

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O3

FFSRecordType next_record_type(FFSFile ffsfile)

{
  Status SVar1;
  long lVar2;
  _FFSIndexElement *p_Var3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  FFSBuffer p_Var9;
  FFSTypeHandle_conflict p_Var10;
  long lVar11;
  ulong size;
  size_t sVar12;
  FFSIndexItem p_Var13;
  char *buffer;
  uint uVar14;
  FFSRecordType FVar15;
  long lVar16;
  int tmp_value;
  uint local_78 [18];
  
  SVar1 = ffsfile->status;
  while( true ) {
    if (SVar1 != OpenForRead) {
      return FFSerror;
    }
    if (ffsfile->tmp_buffer == (FFSBuffer)0x0) {
      p_Var9 = create_FFSBuffer();
      ffsfile->tmp_buffer = p_Var9;
    }
    if (ffsfile->read_ahead != 0) goto LAB_001179c3;
    iVar4 = (*ffsfile->read_func)(ffsfile->file_id,local_78,4,(int *)0x0,(char **)0x0);
    if (iVar4 != 4) goto LAB_001178f7;
    uVar5 = local_78[0] >> 0x18 | (local_78[0] & 0xff0000) >> 8 | (local_78[0] & 0xff00) << 8;
    uVar14 = uVar5 | local_78[0] << 0x18;
    iVar4 = (int)uVar14 >> 0x18;
    if (iVar4 != 3) break;
    ffsfile->next_record_type = FFSdata;
    iVar4 = (*ffsfile->read_func)(ffsfile->file_id,local_78,4,(int *)0x0,(char **)0x0);
    if (iVar4 != 4) {
LAB_001178f7:
      FVar15 = (ffsfile->errno_val == 0) + FFSerror;
      ffsfile->next_record_type = FVar15;
      return FVar15;
    }
    size = ((ulong)uVar14 & 0xffff) << 0x20 |
           (ulong)(local_78[0] >> 0x18 | (local_78[0] & 0xff0000) >> 8 | (local_78[0] & 0xff00) << 8
                  | local_78[0] << 0x18);
    ffsfile->next_data_len = size;
    make_tmp_buffer(ffsfile->tmp_buffer,size);
    buffer = (char *)ffsfile->tmp_buffer->tmp_buffer;
    iVar4 = (*ffsfile->read_func)(ffsfile->file_id,buffer,8,(int *)0x0,(char **)0x0);
    if (iVar4 != 8) goto LAB_001178f7;
    iVar4 = FMformatID_len(buffer);
    ffsfile->next_fid_len = iVar4;
    if ((8 < iVar4) &&
       (uVar5 = (*ffsfile->read_func)
                          (ffsfile->file_id,buffer + 8,(ulong)(iVar4 - 8U),(int *)0x0,(char **)0x0),
       uVar5 != iVar4 - 8U)) goto LAB_001178f7;
    p_Var10 = FFSTypeHandle_from_encode(ffsfile->c,buffer);
    ffsfile->next_actual_handle = p_Var10;
    if ((p_Var10 == (FFSTypeHandle_conflict)0x0) && (ffsfile->index_head != (FFSIndexItem)0x0)) {
      iVar7 = (*ffs_file_lseek_func)(ffsfile->file_id,0,1);
      iVar4 = ffsfile->next_fid_len;
      memcpy(local_78,buffer,(long)iVar4);
      p_Var13 = ffsfile->index_head;
      if (p_Var13 != (FFSIndexItem)0x0) {
        lVar2 = ffsfile->next_data_len;
        do {
          iVar8 = p_Var13->elem_count;
          if (0 < iVar8) {
            lVar11 = 0x18;
            lVar16 = 0;
            do {
              p_Var3 = p_Var13->elements;
              if (((*(int *)((long)p_Var3 + lVar11 + -0x18) == 8) &&
                  (iVar6 = *(int *)((long)&p_Var3->type + lVar11), iVar6 == ffsfile->next_fid_len))
                 && (iVar6 = bcmp(*(void **)((long)p_Var3 + lVar11 + -8),buffer,(long)iVar6),
                    iVar6 == 0)) {
                iVar8 = (*ffs_file_lseek_func)
                                  (ffsfile->file_id,*(size_t *)((long)p_Var3 + lVar11 + -0x10),0);
                if (iVar8 != -1) {
                  ffsfile->read_ahead = 0;
                  FFSread_format(ffsfile);
                  (*ffs_file_lseek_func)(ffsfile->file_id,(long)iVar7,0);
                  ffsfile->read_ahead = 1;
                  ffsfile->next_record_type = FFSdata;
                  buffer = (char *)ffsfile->tmp_buffer->tmp_buffer;
                  memcpy(buffer,local_78,(long)iVar4);
                  ffsfile->next_data_len = lVar2;
                  p_Var10 = FFSTypeHandle_from_encode(ffsfile->c,buffer);
                  ffsfile->next_actual_handle = p_Var10;
                  goto LAB_00117746;
                }
                iVar8 = p_Var13->elem_count;
              }
              lVar16 = lVar16 + 1;
              lVar11 = lVar11 + 0x28;
            } while (lVar16 < iVar8);
          }
          p_Var13 = p_Var13->next;
        } while (p_Var13 != (_FFSIndexItem *)0x0);
      }
    }
LAB_00117746:
    p_Var10 = FFS_target_from_encode(ffsfile->c,buffer);
    ffsfile->next_data_handle = p_Var10;
    if ((p_Var10 != (FFSTypeHandle_conflict)0x0) || (ffsfile->raw_flag != 0)) {
      iVar7 = FFSheader_size(ffsfile->next_actual_handle);
      iVar4 = ffsfile->next_fid_len;
      if ((iVar4 < iVar7) &&
         (iVar8 = (*ffsfile->read_func)
                            (ffsfile->file_id,buffer + iVar4,(long)(iVar7 - iVar4),(int *)0x0,
                             (char **)0x0), iVar8 != iVar7 - iVar4)) goto LAB_001178f7;
      ffsfile->data_block_no = ffsfile->data_block_no + 1;
      goto LAB_001179bc;
    }
    sVar12 = ffsfile->next_data_len - (long)ffsfile->next_fid_len;
    iVar4 = (*ffsfile->read_func)
                      (ffsfile->file_id,buffer + ffsfile->next_fid_len,sVar12,(int *)0x0,
                       (char **)0x0);
    if (sVar12 != (long)iVar4) goto LAB_001178f7;
    ffsfile->read_ahead = 0;
    SVar1 = ffsfile->status;
  }
  if (iVar4 == 4) {
    ffsfile->next_record_type = FFSindex;
  }
  else {
    if (iVar4 == 2) {
      ffsfile->next_record_type = FFSformat;
      ffsfile->next_fid_len = uVar5;
      iVar4 = (*ffsfile->read_func)(ffsfile->file_id,local_78,4,(int *)0x0,(char **)0x0);
      if (iVar4 != 4) goto LAB_001178f7;
      ffsfile->next_data_len =
           (ulong)(local_78[0] >> 0x18 | (local_78[0] & 0xff0000) >> 8 | (local_78[0] & 0xff00) << 8
                  | local_78[0] << 0x18);
      goto LAB_001179bc;
    }
    if (iVar4 != 1) {
      puts("CORRUPT FFSFILE");
      exit(1);
    }
    ffsfile->next_record_type = FFScomment;
  }
  ffsfile->next_data_len = (ulong)uVar5;
LAB_001179bc:
  ffsfile->read_ahead = 1;
LAB_001179c3:
  return ffsfile->next_record_type;
}

Assistant:

static
FFSRecordType
next_record_type(FFSFile ffsfile)
{
    FILE_INT indicator_chunk = 0;
 restart:
    if (ffsfile->status != OpenForRead) {
	return FFSerror;
    }
    if (ffsfile->tmp_buffer == NULL) {
	ffsfile->tmp_buffer = create_FFSBuffer();
    }
    if (ffsfile->read_ahead == FALSE) {
	if (!get_AtomicInt(ffsfile, &indicator_chunk)) {
	    ffsfile->next_record_type = 
		(ffsfile->errno_val) ? FFSerror : FFSend;
	    return ffsfile->next_record_type;
	}
	
	indicator_chunk = ntohl(indicator_chunk);
	switch (indicator_chunk >> 24) {
	case 0x1: /* comment */
		ffsfile->next_record_type = FFScomment;
		ffsfile->next_data_len = indicator_chunk & 0xffffff;
		break;
	case 0x2: /* format */
		ffsfile->next_record_type = FFSformat;
		ffsfile->next_fid_len = indicator_chunk & 0xffffff;
		if (!get_AtomicInt(ffsfile, &indicator_chunk)) {
		    ffsfile->next_record_type = (ffsfile->errno_val) ? FFSerror : FFSend;
		    return ffsfile->next_record_type;
		}
		ffsfile->next_data_len = ntohl(indicator_chunk);
		break;
	case 0x3: /* data */ {
		char *tmp_buf;
		int header_size;
		DATA_LEN_TYPE top_data_len_bytes;
		ffsfile->next_record_type = FFSdata;
		top_data_len_bytes = (indicator_chunk & 0xffff);
		if (!get_AtomicInt(ffsfile, &indicator_chunk)) {
		    ffsfile->next_record_type = (ffsfile->errno_val) ? FFSerror : FFSend;
		    return ffsfile->next_record_type;
		}
		ffsfile->next_data_len = ntohl(indicator_chunk) + 
		    (top_data_len_bytes << 32);
		make_tmp_buffer(ffsfile->tmp_buffer, ffsfile->next_data_len);
		tmp_buf = ffsfile->tmp_buffer->tmp_buffer;
		/* first get format ID, at least 8 bytes */
		if (ffsfile->read_func(ffsfile->file_id, tmp_buf, 8, NULL,
                                       NULL) != 8) {
		    ffsfile->next_record_type = (ffsfile->errno_val) ?
                        FFSerror : FFSend;
		    return ffsfile->next_record_type;
		}
		ffsfile->next_fid_len = FMformatID_len(tmp_buf);
		if (ffsfile->next_fid_len > 8) {
		    int more = ffsfile->next_fid_len - 8;
		    if (ffsfile->read_func(ffsfile->file_id, tmp_buf + 8,
                                           more, NULL, NULL) != more) {
			ffsfile->next_record_type = (ffsfile->errno_val) ?
                            FFSerror : FFSend;
			return ffsfile->next_record_type;
		    }
		}

		ffsfile->next_actual_handle = 
		    FFSTypeHandle_from_encode(ffsfile->c, tmp_buf);

                if (!ffsfile->next_actual_handle && ffsfile->index_head) {

                    struct _FFSIndexItem *index = NULL;
                    off_t fpos_bak = ffs_file_lseek_func(ffsfile->file_id, 0, SEEK_CUR);
		    int fid_len = ffsfile->next_fid_len;
		    char tmp_fid_storage[64];
		    size_t tmp_data_len;
		    int done = 0;
		    assert(sizeof(tmp_fid_storage) > fid_len);
		    /* store away the format ID we've read */
		    memcpy(tmp_fid_storage, tmp_buf, fid_len);
		    tmp_data_len = ffsfile->next_data_len;

                    index = ffsfile->index_head;
                    while (!done && index) {
			int i;
			for (i=0 ; i < index->elem_count; i++) {
			    struct _FFSIndexElement *elem;
			    elem = &index->elements[i];
			    if (elem->type == FFSformat &&
				elem->fid_len == ffsfile->next_fid_len &&
				!(memcmp(elem->format_id,
					 tmp_buf, ffsfile->next_fid_len))) {

				if (ffs_file_lseek_func(ffsfile->file_id, elem->fpos, SEEK_SET) != -1) {
				    ffsfile->read_ahead = FALSE;
				    FFSread_format(ffsfile);
				    ffs_file_lseek_func(ffsfile->file_id, fpos_bak, SEEK_SET);
				    ffsfile->read_ahead = TRUE;
				    ffsfile->next_record_type = FFSdata;
				    /* tmp_buf might have changed */
				    tmp_buf = ffsfile->tmp_buffer->tmp_buffer;
				    /* put back the format ID we read earlier */
				    memcpy(tmp_buf, tmp_fid_storage, fid_len);
				    ffsfile->next_data_len = tmp_data_len;

				    ffsfile->next_actual_handle = 
					FFSTypeHandle_from_encode(ffsfile->c,
								  tmp_buf);
				    done++;
				    break;
				}
			    }
                        }

                        index = index->next;
                    }
                }
		/* GSE
		 * If ffsfile->next_actual_handle is NULL here, we have 
		 * a problem.  The only way this should happen is if we 
		 * have used FFSset_fpos() to seek forward in a file, 
		 * skipping over the Format record associated with this
		 * data item.  But now we NEED IT.  We must :
		 *  1) Save our current FPOS
		 *  2) find the format in the index
		 *  3) lseek the its location (set read_ahead to false)
		 *  4) read the format
		 *  5) lseek back to our saved FPOS
		 *  6) call FFSTypeHandle_from_encode() again to set
		 *     next_actual_handle correctly.
		 */
		ffsfile->next_data_handle = 
		    FFS_target_from_encode(ffsfile->c, tmp_buf);

		if ((ffsfile->next_data_handle == NULL) &&
                    (!ffsfile->raw_flag)) {
		    /* no target for this format, discard */
		    size_t more = ffsfile->next_data_len - ffsfile->next_fid_len;
		    if (ffsfile->read_func(ffsfile->file_id, tmp_buf +
                                           ffsfile->next_fid_len, more, NULL,
                                           NULL) != more) {
			ffsfile->next_record_type = (ffsfile->errno_val) ?
                            FFSerror : FFSend;
			return ffsfile->next_record_type;
		    }
		    ffsfile->read_ahead = FALSE;
		    goto restart;
		    
		}
		header_size = FFSheader_size(ffsfile->next_actual_handle);
		if (header_size > ffsfile->next_fid_len) {
		    int more = header_size - ffsfile->next_fid_len;
		    if (ffsfile->read_func(ffsfile->file_id, tmp_buf +
                                           ffsfile->next_fid_len, more, NULL,
                                           NULL) != more) {
			ffsfile->next_record_type = (ffsfile->errno_val) ?
                            FFSerror : FFSend;
			return ffsfile->next_record_type;
		    }
		}
                ffsfile->data_block_no++;
		break;
	case 0x4: /* index */
		ffsfile->next_record_type = FFSindex;
		ffsfile->next_data_len = indicator_chunk & 0xffffff;
/*		if (!ffsfile->expose_index) {
		    ffs_file_lseek_func((int)(intptr_t)ffsfile->file_id, INDEX_BLOCK_SIZE-4, SEEK_CUR);
		    ffsfile->read_ahead = FALSE;
		    return next_record_type(ffsfile);
		    }*/
		break;
	default:
	    printf("CORRUPT FFSFILE\n");
	    exit(1);
	}
	}
	ffsfile->read_ahead = TRUE;
    }
    return ffsfile->next_record_type;
}